

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

void QCoreApplication::removeLibraryPath(QString *path)

{
  QStringList *this;
  bool bVar1;
  Type *pTVar2;
  difference_type dVar3;
  QGlobalStatic *this_00;
  QSharedDataPointer<QDirPrivate> this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_60;
  QArrayDataPointer<char16_t> local_48;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((path->d).size == 0) goto LAB_002586e4;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::QDir((QDir *)local_30,path);
  QDir::canonicalPath((QString *)&local_48,(QDir *)local_30);
  this_00 = (QGlobalStatic *)local_30;
  QDir::~QDir((QDir *)this_00);
  if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
    pTVar2 = QGlobalStatic::operator_cast_to_QCoreApplicationData_(this_00);
    local_30._0_8_ = &pTVar2->libraryPathMutex;
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QRecursiveMutex::lock((QRecursiveMutex *)local_30._0_8_);
    local_30[8] = 1;
    this = &pTVar2->manual_libpaths;
    if ((pTVar2->manual_libpaths).d.ptr == (QString *)0x0) {
      libraryPathsLocked();
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)&pTVar2->app_libpaths,(QString *)&local_48,
                         CaseSensitive);
      if (bVar1) {
        QArrayDataPointer<QString>::operator=(&this->d,&(pTVar2->app_libpaths).d);
        QtPrivate::sequential_erase_with_copy<QList<QString>,QString>(this,(QString *)&local_48);
        goto LAB_002586bc;
      }
    }
    else {
      dVar3 = QtPrivate::sequential_erase_with_copy<QList<QString>,QString>
                        (this,(QString *)&local_48);
      if (dVar3 != 0) {
LAB_002586bc:
        this_01.d.ptr =
             (totally_ordered_wrapper<QDirPrivate_*>)
             (totally_ordered_wrapper<QDirPrivate_*>)local_30._0_8_;
        QRecursiveMutex::unlock((QRecursiveMutex *)local_30._0_8_);
        local_30._8_8_ = local_30._8_8_ & 0xffffffffffffff00;
        QFactoryLoader::refreshAll((QFactoryLoader *)this_01.d.ptr);
      }
    }
    QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_30);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
LAB_002586e4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCoreApplication::removeLibraryPath(const QString &path)
{
    if (path.isEmpty())
        return;

    QString canonicalPath = QDir(path).canonicalPath();
    if (canonicalPath.isEmpty())
        return;

    QCoreApplicationData *d = coreappdata;
    QMutexLocker locker(&d->libraryPathMutex);

    QStringList *libpaths = &d->manual_libpaths;
    if (d->libPathsManuallySet()) {
        if (libpaths->removeAll(canonicalPath) == 0)
            return;
    } else {
        // make sure that library paths is initialized
        libraryPathsLocked();
        QStringList *app_libpaths = &d->app_libpaths;
        if (!app_libpaths->contains(canonicalPath))
            return;

        *libpaths = *app_libpaths;
        libpaths->removeAll(canonicalPath);
        Q_ASSERT(d->libPathsManuallySet());
    }

    locker.unlock();
    QFactoryLoader::refreshAll();
}